

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getInitialization_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  pointer ptVar1;
  GLchar *__s;
  TestError *this_00;
  InitializerListTest *pIVar2;
  char *pcVar3;
  int iVar4;
  uint column;
  int iVar5;
  int iVar6;
  bool bVar7;
  string local_70;
  
  iVar5 = this->m_current_test_case_index;
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(ptVar1[iVar5].m_initializer) {
  case VECTOR:
    getVectorInitializer_abi_cxx11_(&local_70,this,0,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6cdd7;
  case MATRIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorArrayList_abi_cxx11_(&local_70,this,ptVar1[iVar5].m_n_cols,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case MATRIX_ROWS:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorArrayCtr_abi_cxx11_(&local_70,this,ptVar1[iVar5].m_n_cols,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case STRUCT:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,0,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,2,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    pIVar2 = (InitializerListTest *)0x18083b8;
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorValues_abi_cxx11_(&local_70,pIVar2,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case ARRAY_VECTOR_CTR:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorArrayCtr_abi_cxx11_(&local_70,this,4,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case ARRAY_VECTOR_LIST:
  case UNSIZED_ARRAY_VECTOR:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorArrayList_abi_cxx11_(&local_70,this,4,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    goto LAB_00a6c7c6;
  case ARRAY_MATRIX_CTR:
    __s = Utils::getTypeName(FLOAT,ptVar1[iVar5].m_n_cols,ptVar1[iVar5].m_n_rows);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,__s,(allocator<char> *)&stack0xffffffffffffffb0);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    iVar6 = 0;
    while (iVar6 != 4) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      pIVar2 = (InitializerListTest *)0x179c828;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      column = 0;
      while (column < ptVar1[iVar5].m_n_cols) {
        getVectorValues_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,pIVar2,column,ptVar1[iVar5].m_n_rows);
        pIVar2 = (InitializerListTest *)&stack0xffffffffffffffb0;
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
        column = column + 1;
        if (column < ptVar1[iVar5].m_n_cols) {
          pIVar2 = (InitializerListTest *)0x16dc740;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar4 = iVar6 + 1;
      bVar7 = iVar6 != 3;
      iVar6 = iVar4;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00a6cdd7:
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_MATRIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    iVar6 = 4;
    while (iVar4 = iVar6 + -1, iVar6 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorArrayList_abi_cxx11_(&local_70,this,ptVar1[iVar5].m_n_cols,ptVar1[iVar5].m_n_rows);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar6 != 1;
      iVar6 = iVar4;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    iVar6 = 4;
    while (iVar4 = iVar6 + -1, iVar6 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,0,ptVar1[iVar5].m_n_rows);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,2,ptVar1[iVar5].m_n_rows);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar6 != 1;
      iVar6 = iVar4;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case NESTED_STRUCT_CTR:
    pcVar3 = "StructureWithStructure(BasicStructure(";
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,(InitializerListTest *)pcVar3,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar2 = (InitializerListTest *)0x16dc740;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,pIVar2,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar2 = (InitializerListTest *)0x1735cef;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,pIVar2,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case NESTED_STRUCT_LIST:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_00a6c7c6:
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar5 = 3;
    while (iVar6 = iVar5 + -1, iVar5 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,3,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar5 != 1;
      iVar5 = iVar6;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    pIVar2 = (InitializerListTest *)0x18083b8;
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,pIVar2,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar5 = 3;
    while (iVar6 = iVar5 + -1, iVar5 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar2 = (InitializerListTest *)0x16dc740;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_70,pIVar2,3,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar5 != 1;
      iVar5 = iVar6;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    iVar5 = 4;
    while (iVar6 = iVar5 + -1, iVar5 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar5 != 1;
      iVar5 = iVar6;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    iVar5 = 2;
    while (iVar6 = iVar5 + -1, iVar5 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pIVar2 = (InitializerListTest *)0x16dc70c;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_70,pIVar2,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      pcVar3 = " , ";
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_70,(InitializerListTest *)pcVar3,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar2 = (InitializerListTest *)0x1735cef;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_70,pIVar2,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar7 = iVar5 == 2;
      iVar5 = iVar6;
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,1,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_70,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    pIVar2 = (InitializerListTest *)0x16dc750;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,pIVar2,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar3 = " , vec4[2]( ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,(InitializerListTest *)pcVar3,1,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar3 = " , ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,(InitializerListTest *)pcVar3,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar3 = " , ";
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_70,(InitializerListTest *)pcVar3,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3721);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getInitialization()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string initialization;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		initialization.append(getVectorInitializer(0 /*column*/, test_case.m_n_rows));

		break;

	case MATRIX:
		initialization = "{ ";
		initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case MATRIX_ROWS:
	{
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");
	}
	break;

	case STRUCT:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		initialization = "{ ";
		initialization.append(getVectorValues(0 /* column */, 4 /* size */));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_LIST:
	case UNSIZED_ARRAY_VECTOR:
		initialization = "{ ";
		initialization.append(getVectorArrayList(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_CTR:
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_MATRIX:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case ARRAY_MATRIX_CTR:
	{
		const std::string& type_name = Utils::getTypeName(Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows);

		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append(type_name);
			initialization.append("(");
			for (GLuint col = 0; col < test_case.m_n_cols; ++col)
			{
				initialization.append(getVectorValues(col, test_case.m_n_rows));

				if (col + 1 < test_case.m_n_cols)
				{
					initialization.append(", ");
				}
			}
			initialization.append(")");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");
	}
	break;

	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
			initialization.append(", ");
			initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_CTR:
		initialization = "StructureWithStructure(BasicStructure(";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append("), ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	case NESTED_STRUCT_LIST:
		initialization = "{ { ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }, ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		initialization = "{ ";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorConstructor(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		initialization = "{\n";

		for (GLuint i = 0; i < 2; ++i)
		{
			initialization.append("StructureWithStructure(\n");
			initialization.append("BasicStructure(");

			initialization.append(getVectorConstructor(0 /* column */, 4));
			initialization.append(" , ");
			initialization.append(getVectorConstructor(1 /* column */, 4));

			initialization.append("), ");

			initialization.append(getVectorConstructor(2 /* column */, 4));

			initialization.append(")");

			initialization.append(" , ");

			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 2)
			{
				initialization.append(" , ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		initialization = "{ ";
		initialization.append("{ ");
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append("{ ");
		initialization.append(getVectorInitializer(1 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }");
		initialization.append(" }");
		initialization.append(", ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		initialization = "StructureWithStructureWithArray(";
		initialization.append("StructureWithArray(");
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(" , vec4[2]( ");
		initialization.append(getVectorConstructor(1 /* column */, 4));
		initialization.append(" , ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append(" )");
		initialization.append(")");
		initialization.append(" , ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return initialization;
}